

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O3

int idaLs_AccessLMemB(void *ida_mem,int which,char *fname,IDAMem *IDA_mem,IDAadjMem *IDAADJ_mem,
                     IDABMem *IDAB_mem,IDALsMemB *idalsB_mem)

{
  IDAadjMem pIVar1;
  IDABMemRec *pIVar2;
  int line;
  IDABMemRec **ppIVar3;
  int iVar4;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    iVar4 = -1;
    ida_mem = (IDAMem)0x0;
    error_code = -1;
    line = 0xa55;
  }
  else {
    *IDA_mem = (IDAMem)ida_mem;
    if (*(int *)((long)ida_mem + 0x848) == 0) {
      msgfmt = "Illegal attempt to call before calling IDAAdjInit.";
      iVar4 = -0x65;
      error_code = -0x65;
      line = 0xa5e;
    }
    else {
      pIVar1 = *(IDAadjMem *)((long)ida_mem + 0x840);
      *IDAADJ_mem = pIVar1;
      if (which < pIVar1->ia_nbckpbs) {
        ppIVar3 = &pIVar1->IDAB_mem;
        do {
          pIVar2 = *ppIVar3;
          *IDAB_mem = pIVar2;
          ppIVar3 = &pIVar2->ida_next;
        } while (pIVar2->ida_index != which);
        if ((IDALsMemB)pIVar2->ida_lmem != (IDALsMemB)0x0) {
          *idalsB_mem = (IDALsMemB)pIVar2->ida_lmem;
          return 0;
        }
        ida_mem = *IDA_mem;
        fname = "idaLs_AccessLMemB";
        msgfmt = "Linear solver memory is NULL for the backward integration.";
        iVar4 = -0x66;
        error_code = -0x66;
        line = 0xa77;
      }
      else {
        ida_mem = *IDA_mem;
        msgfmt = "Illegal value for which.";
        iVar4 = -3;
        error_code = -3;
        line = 0xa67;
      }
    }
  }
  IDAProcessError((IDAMem)ida_mem,error_code,line,fname,
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                  ,msgfmt);
  return iVar4;
}

Assistant:

int idaLs_AccessLMemB(void* ida_mem, int which, const char* fname,
                      IDAMem* IDA_mem, IDAadjMem* IDAADJ_mem, IDABMem* IDAB_mem,
                      IDALsMemB* idalsB_mem)
{
  /* access IDAMem structure */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDALS_MEM_NULL, __LINE__, fname, __FILE__,
                    MSG_LS_IDAMEM_NULL);
    return (IDALS_MEM_NULL);
  }
  *IDA_mem = (IDAMem)ida_mem;

  /* access IDAadjMem structure */
  if ((*IDA_mem)->ida_adjMallocDone == SUNFALSE)
  {
    IDAProcessError(*IDA_mem, IDALS_NO_ADJ, __LINE__, fname, __FILE__,
                    MSG_LS_NO_ADJ);
    return (IDALS_NO_ADJ);
  }
  *IDAADJ_mem = (*IDA_mem)->ida_adj_mem;

  /* Check the value of which */
  if (which >= (*IDAADJ_mem)->ia_nbckpbs)
  {
    IDAProcessError(*IDA_mem, IDALS_ILL_INPUT, __LINE__, fname, __FILE__,
                    MSG_LS_BAD_WHICH);
    return (IDALS_ILL_INPUT);
  }

  /* Find the IDABMem entry in the linked list corresponding to which */
  *IDAB_mem = (*IDAADJ_mem)->IDAB_mem;
  while ((*IDAB_mem) != NULL)
  {
    if (which == (*IDAB_mem)->ida_index) { break; }
    *IDAB_mem = (*IDAB_mem)->ida_next;
  }

  /* access IDALsMemB structure */
  if ((*IDAB_mem)->ida_lmem == NULL)
  {
    IDAProcessError(*IDA_mem, IDALS_LMEMB_NULL, __LINE__, __func__, __FILE__,
                    MSG_LS_LMEMB_NULL);
    return (IDALS_LMEMB_NULL);
  }
  *idalsB_mem = (IDALsMemB)((*IDAB_mem)->ida_lmem);

  return (IDALS_SUCCESS);
}